

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

cmSourceGroup * __thiscall cmMakefile::GetOrCreateSourceGroup(cmMakefile *this,string *name)

{
  cmValue cVar1;
  cmSourceGroup *pcVar2;
  string_view str;
  string_view sep;
  string delimiters;
  allocator<char> local_59;
  string local_58;
  char *local_38;
  size_t local_30;
  char local_28 [16];
  
  local_38 = local_28;
  local_30 = 0;
  local_28[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"SOURCE_GROUP_DELIMITER",&local_59);
  cVar1 = GetDefinition(this,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  if (cVar1.Value == (string *)0x0) {
    std::__cxx11::string::assign((char *)&local_38);
  }
  else {
    std::__cxx11::string::_M_assign((string *)&local_38);
  }
  str._M_str = (name->_M_dataplus)._M_p;
  str._M_len = name->_M_string_length;
  sep._M_str = local_38;
  sep._M_len = local_30;
  cmTokenize_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_58,str,sep);
  pcVar2 = GetOrCreateSourceGroup
                     (this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&local_58);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  return pcVar2;
}

Assistant:

cmSourceGroup* cmMakefile::GetOrCreateSourceGroup(const std::string& name)
{
  std::string delimiters;
  if (cmValue p = this->GetDefinition("SOURCE_GROUP_DELIMITER")) {
    delimiters = *p;
  } else {
    delimiters = "/\\";
  }
  return this->GetOrCreateSourceGroup(cmTokenize(name, delimiters));
}